

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
reserve(InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
        *this,size_t n)

{
  Point3<float> *pPVar1;
  long lVar2;
  int i;
  ulong uVar3;
  anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
  *paVar4;
  
  if (this->ptr == (Point3<float> *)0x0) {
    uVar3 = 0x10;
  }
  else {
    uVar3 = this->nAlloc;
  }
  if (uVar3 < n) {
    pPVar1 = pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::
             allocate_object<pbrt::Point3<float>>
                       ((polymorphic_allocator<pbrt::Point3<float>> *)this,n);
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < this->nStored; uVar3 = uVar3 + 1) {
      paVar4 = (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
                *)this->ptr;
      if ((anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
           *)this->ptr ==
          (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
           *)0x0) {
        paVar4 = &this->field_2;
      }
      *(undefined4 *)((long)&(pPVar1->super_Tuple3<pbrt::Point3,_float>).z + lVar2) =
           *(undefined4 *)((long)paVar4 + lVar2 + 8);
      *(undefined8 *)((long)&(pPVar1->super_Tuple3<pbrt::Point3,_float>).x + lVar2) =
           *(undefined8 *)((long)paVar4 + lVar2);
      lVar2 = lVar2 + 0xc;
    }
    pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::deallocate_object<pbrt::Point3<float>>
              ((polymorphic_allocator<pbrt::Point3<float>> *)this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pPVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }